

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O2

int get_av1config_from_obu(uint8_t *buffer,size_t length,int is_annexb,Av1Config *config)

{
  int bits;
  void *pvVar1;
  aom_codec_err_t aVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t uVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  bool bVar13;
  long lStack_c0;
  int result;
  int local_ac;
  aom_read_bit_buffer local_a8;
  uint local_7c;
  uint local_78;
  int local_74;
  int local_70;
  uint local_6c;
  size_t obu_header_length;
  size_t sequence_header_length;
  ObuHeader obu_header;
  
  if (config == (Av1Config *)0x0 || (length == 0 || buffer == (uint8_t *)0x0)) {
    return -1;
  }
  obu_header.has_extension = 0;
  obu_header.temporal_layer_id = 0;
  obu_header.spatial_layer_id = 0;
  obu_header._28_4_ = 0;
  obu_header.size = 0;
  obu_header.type = 0;
  obu_header._9_3_ = 0;
  obu_header.has_size_field = 0;
  sequence_header_length = 0;
  obu_header_length = 0;
  aVar2 = aom_read_obu_header_and_size
                    (buffer,length,is_annexb,&obu_header,&sequence_header_length,&obu_header_length)
  ;
  if (aVar2 != AOM_CODEC_OK) {
    return -1;
  }
  if (obu_header.type != OBU_SEQUENCE_HEADER) {
    return -1;
  }
  if (length < obu_header_length + sequence_header_length) {
    return -1;
  }
  config->chroma_subsampling_y = '\0';
  config->chroma_sample_position = '\0';
  config->initial_presentation_delay_present = '\0';
  config->initial_presentation_delay_minus_one = '\0';
  config->seq_profile = '\0';
  config->seq_level_idx_0 = '\0';
  config->seq_tier_0 = '\0';
  config->high_bitdepth = '\0';
  config->twelve_bit = '\0';
  config->monochrome = '\0';
  config->chroma_subsampling_x = '\0';
  config->chroma_subsampling_y = '\0';
  config->marker = '\x01';
  config->version = '\x01';
  local_a8.error_handler_data = &result;
  result = 0;
  local_a8.bit_buffer = buffer + obu_header_length;
  local_a8.bit_buffer_end = local_a8.bit_buffer + sequence_header_length;
  local_a8.bit_offset = 0;
  local_a8.error_handler = bitreader_error_handler;
  uVar3 = aom_rb_read_literal(&local_a8,3);
  if (result == -1) {
    pcVar11 = "av1c: Could not read bits for seq_profile, value=%d result=%d.\n";
LAB_0011fc18:
    uVar10 = (ulong)uVar3;
  }
  else {
    config->seq_profile = (uint8_t)uVar3;
    uVar3 = aom_rb_read_bit(&local_a8);
    if (result == -1) {
      pcVar11 = "av1c: Error reading bit for still_picture, value=%d result=%d.\n";
      goto LAB_0011fc18;
    }
    uVar3 = aom_rb_read_bit(&local_a8);
    if (result == -1) {
      pcVar11 = "av1c: Error reading bit for reduced_still_picture_header, value=%d result=%d.\n";
LAB_0011f67a:
      uVar10 = (ulong)uVar3;
    }
    else {
      local_7c = uVar3;
      if (uVar3 == 0) {
        uVar6 = aom_rb_read_bit(&local_a8);
        pvVar1 = local_a8.error_handler_data;
        uVar10 = (ulong)uVar6;
        if (result == -1) {
          pcVar11 = "av1c: Error reading bit for timing_info_present_flag, value=%d result=%d.\n";
        }
        else {
          iVar12 = 0;
          if (uVar6 == 0) goto LAB_0011f1f5;
          local_ac = 0;
          local_a8.error_handler_data = &local_ac;
          uVar3 = aom_rb_read_literal(&local_a8,0x20);
          if (local_ac == -1) {
            pcVar11 = 
            "av1c: Could not read bits for num_units_in_display_tick, value=%d result=%d.\n";
LAB_0011f897:
            fprintf(_stderr,pcVar11,(ulong)uVar3,0xffffffffffffffff);
            return -1;
          }
          uVar3 = aom_rb_read_literal(&local_a8,0x20);
          if (local_ac == -1) {
            pcVar11 = "av1c: Could not read bits for time_scale, value=%d result=%d.\n";
            goto LAB_0011f897;
          }
          uVar3 = aom_rb_read_bit(&local_a8);
          if (local_ac == -1) {
            pcVar11 = "av1c: Error reading bit for equal_picture_interval, value=%d result=%d.\n";
            goto LAB_0011f897;
          }
          if ((uVar3 != 0) && (uVar5 = aom_rb_read_uvlc(&local_a8), local_ac == -1)) {
            fprintf(_stderr,
                    "av1c: Could not read bits for num_ticks_per_picture_minus_1, value=%u.\n",
                    (ulong)uVar5);
            pvVar1 = local_a8.error_handler_data;
          }
          local_a8.error_handler_data = pvVar1;
          iVar12 = 0;
          if (local_ac != 0) {
            return -1;
          }
          uVar3 = aom_rb_read_bit(&local_a8);
          pvVar1 = local_a8.error_handler_data;
          if (result == -1) {
            pcVar11 = 
            "av1c: Error reading bit for decoder_model_info_present_flag, value=%d result=%d.\n";
            goto LAB_0011fc18;
          }
          local_a8.error_handler_data = pvVar1;
          if (uVar3 != 0) {
            local_ac = 0;
            local_a8.error_handler_data = &local_ac;
            uVar3 = aom_rb_read_literal(&local_a8,5);
            if (local_ac == -1) {
              pcVar11 = 
              "av1c: Could not read bits for buffer_delay_length_minus_1, value=%d result=%d.\n";
              uVar9 = 0xffffffffffffffff;
              uVar10 = (ulong)uVar3;
              goto LAB_0011fc1f;
            }
            uVar7 = aom_rb_read_literal(&local_a8,0x20);
            if (local_ac == -1) {
              pcVar11 = 
              "av1c: Could not read bits for num_units_in_decoding_tick, value=%d result=%d.\n";
            }
            else {
              uVar7 = aom_rb_read_literal(&local_a8,5);
              if (local_ac == -1) {
                pcVar11 = 
                "av1c: Could not read bits for buffer_removal_time_length_minus_1, value=%d result=%d.\n"
                ;
              }
              else {
                uVar7 = aom_rb_read_literal(&local_a8,5);
                if (local_ac != -1) {
                  iVar12 = uVar3 + 1;
                  local_a8.error_handler_data = pvVar1;
                  if (iVar12 == -1) {
                    return -1;
                  }
                  goto LAB_0011f1f5;
                }
                pcVar11 = 
                "av1c: Could not read bits for frame_presentation_time_length_minus_1, value=%d result=%d.\n"
                ;
              }
            }
            uVar9 = 0xffffffffffffffff;
            uVar10 = (ulong)uVar7;
            goto LAB_0011fc1f;
          }
LAB_0011f1f5:
          uVar3 = aom_rb_read_bit(&local_a8);
          if (result == -1) {
            pcVar11 = 
            "av1c: Error reading bit for initial_presentation_delay_present, value=%d result=%d.\n";
            goto LAB_0011fc18;
          }
          config->initial_presentation_delay_present = (uint8_t)uVar3;
          uVar7 = aom_rb_read_literal(&local_a8,5);
          if (result != -1) {
            local_74 = iVar12 + 1;
            local_78 = uVar7;
            for (iVar12 = 0; iVar12 <= (int)uVar7; iVar12 = iVar12 + 1) {
              uVar3 = aom_rb_read_literal(&local_a8,0xc);
              if (result == -1) {
                pcVar11 = "av1c: Could not read bits for operating_point_idc, value=%d result=%d.\n"
                ;
                goto LAB_0011fc18;
              }
              uVar4 = aom_rb_read_literal(&local_a8,5);
              if (result == -1) {
                pcVar11 = "av1c: Could not read bits for seq_level_idx, value=%d result=%d.\n";
                goto LAB_0011f6af;
              }
              uVar3 = 0;
              if ((7 < (int)uVar4) && (uVar3 = aom_rb_read_bit(&local_a8), result == -1)) {
                pcVar11 = "av1c: Error reading bit for seq_tier_this_op, value=%d result=%d.\n";
                goto LAB_0011f67a;
              }
              pvVar1 = local_a8.error_handler_data;
              local_6c = uVar3;
              if (uVar6 != 0) {
                uVar3 = aom_rb_read_bit(&local_a8);
                bits = local_74;
                pvVar1 = local_a8.error_handler_data;
                if (result == -1) {
                  pcVar11 = 
                  "av1c: Error reading bit for decoder_model_present_for_op, value=%d result=%d.\n";
                  goto LAB_0011fc18;
                }
                if (uVar3 != 0) {
                  local_ac = 0;
                  local_a8.error_handler_data = &local_ac;
                  local_70 = iVar12;
                  uVar3 = aom_rb_read_literal(&local_a8,local_74);
                  if (local_ac == -1) {
                    pcVar11 = 
                    "av1c: Could not read bits for decoder_buffer_delay, value=%d result=%d.\n";
                    goto LAB_0011f897;
                  }
                  uVar3 = aom_rb_read_literal(&local_a8,bits);
                  if (local_ac == -1) {
                    pcVar11 = 
                    "av1c: Could not read bits for encoder_buffer_delay, value=%d result=%d.\n";
                    goto LAB_0011f897;
                  }
                  uVar3 = aom_rb_read_bit(&local_a8);
                  uVar7 = local_78;
                  iVar12 = local_70;
                  if (local_ac == -1) {
                    pcVar11 = 
                    "av1c: Error reading bit for low_delay_mode_flag, value=%d result=%d.\n";
                    goto LAB_0011f897;
                  }
                }
              }
              local_a8.error_handler_data = pvVar1;
              if (config->initial_presentation_delay_present != '\0') {
                uVar3 = aom_rb_read_bit(&local_a8);
                if (result == -1) {
                  pcVar11 = 
                  "av1c: Error reading bit for initial_presentation_delay_present_for_this_op, value=%d result=%d.\n"
                  ;
                  goto LAB_0011fc18;
                }
                if ((uVar3 != 0) && (uVar3 = aom_rb_read_literal(&local_a8,4), result == -1)) {
                  pcVar11 = 
                  "av1c: Could not read bits for initial_presentation_delay_minus_1, value=%d result=%d.\n"
                  ;
                  goto LAB_0011fc18;
                }
              }
              if (iVar12 == 0) {
                config->seq_level_idx_0 = (uint8_t)uVar4;
                config->seq_tier_0 = (uint8_t)local_6c;
                config->initial_presentation_delay_present = '\0';
                config->initial_presentation_delay_minus_one = '\0';
              }
            }
            goto LAB_0011ef21;
          }
          pcVar11 = 
          "av1c: Could not read bits for operating_points_cnt_minus_1, value=%d result=%d.\n";
          uVar10 = (ulong)uVar7;
        }
      }
      else {
        config->initial_presentation_delay_present = '\0';
        uVar3 = aom_rb_read_literal(&local_a8,5);
        if (result == -1) {
          pcVar11 = "av1c: Could not read bits for seq_level_idx_0, value=%d result=%d.\n";
          goto LAB_0011fc18;
        }
        config->seq_level_idx_0 = (uint8_t)uVar3;
        config->seq_tier_0 = '\0';
LAB_0011ef21:
        uVar3 = aom_rb_read_literal(&local_a8,4);
        if (result == -1) {
          pcVar11 = "av1c: Could not read bits for frame_width_bits_minus_1, value=%d result=%d.\n";
          uVar10 = (ulong)uVar3;
        }
        else {
          uVar4 = aom_rb_read_literal(&local_a8,4);
          if (result != -1) {
            uVar3 = aom_rb_read_literal(&local_a8,uVar3 + 1);
            if (result == -1) {
              pcVar11 = 
              "av1c: Could not read bits for max_frame_width_minus_1, value=%d result=%d.\n";
            }
            else {
              uVar3 = aom_rb_read_literal(&local_a8,uVar4 + 1);
              uVar6 = local_7c;
              if (result == -1) {
                pcVar11 = 
                "av1c: Could not read bits for max_frame_height_minus_1, value=%d result=%d.\n";
              }
              else if (local_7c == 0) {
                uVar3 = aom_rb_read_bit(&local_a8);
                if (result == -1) {
                  pcVar11 = 
                  "av1c: Error reading bit for frame_id_numbers_present_flag, value=%d result=%d.\n"
                  ;
                }
                else {
                  if ((char)uVar3 == '\0') goto LAB_0011efde;
                  uVar3 = aom_rb_read_literal(&local_a8,4);
                  if (result == -1) {
                    pcVar11 = 
                    "av1c: Could not read bits for delta_frame_id_length_minus_2, value=%d result=%d.\n"
                    ;
                  }
                  else {
                    uVar3 = aom_rb_read_literal(&local_a8,3);
                    if (result != -1) goto LAB_0011efde;
                    pcVar11 = 
                    "av1c: Could not read bits for additional_frame_id_length_minus_1, value=%d result=%d.\n"
                    ;
                  }
                }
              }
              else {
LAB_0011efde:
                uVar3 = aom_rb_read_bit(&local_a8);
                if (result == -1) {
                  pcVar11 = 
                  "av1c: Error reading bit for use_128x128_superblock, value=%d result=%d.\n";
                }
                else {
                  uVar3 = aom_rb_read_bit(&local_a8);
                  if (result == -1) {
                    pcVar11 = 
                    "av1c: Error reading bit for enable_filter_intra, value=%d result=%d.\n";
                  }
                  else {
                    uVar3 = aom_rb_read_bit(&local_a8);
                    if (result == -1) {
                      pcVar11 = 
                      "av1c: Error reading bit for enable_intra_edge_filter, value=%d result=%d.\n";
                    }
                    else if (uVar6 == 0) {
                      uVar3 = aom_rb_read_bit(&local_a8);
                      if (result == -1) {
                        pcVar11 = 
                        "av1c: Error reading bit for enable_interintra_compound, value=%d result=%d.\n"
                        ;
                      }
                      else {
                        uVar3 = aom_rb_read_bit(&local_a8);
                        if (result == -1) {
                          pcVar11 = 
                          "av1c: Error reading bit for enable_masked_compound, value=%d result=%d.\n"
                          ;
                        }
                        else {
                          uVar3 = aom_rb_read_bit(&local_a8);
                          if (result == -1) {
                            pcVar11 = 
                            "av1c: Error reading bit for enable_warped_motion, value=%d result=%d.\n"
                            ;
                          }
                          else {
                            uVar3 = aom_rb_read_bit(&local_a8);
                            if (result == -1) {
                              pcVar11 = 
                              "av1c: Error reading bit for enable_dual_filter, value=%d result=%d.\n"
                              ;
                            }
                            else {
                              uVar4 = aom_rb_read_bit(&local_a8);
                              if (result == -1) {
                                pcVar11 = 
                                "av1c: Error reading bit for enable_order_hint, value=%d result=%d.\n"
                                ;
                                goto LAB_0011f6af;
                              }
                              if (uVar4 == 0) {
LAB_0011f41c:
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (result == -1) {
                                  pcVar11 = 
                                  "av1c: Error reading bit for seq_choose_screen_content_tools, value=%d result=%d.\n"
                                  ;
                                }
                                else if (uVar3 == 0) {
                                  uVar3 = aom_rb_read_bit(&local_a8);
                                  if (result == -1) {
                                    pcVar11 = 
                                    "av1c: Error reading bit for seq_force_screen_content_tools_val, value=%d result=%d.\n"
                                    ;
                                  }
                                  else {
                                    if (0 < (int)uVar3) goto LAB_0011f44e;
LAB_0011f47c:
                                    if ((uVar4 == 0) ||
                                       (uVar3 = aom_rb_read_literal(&local_a8,3), result != -1))
                                    goto LAB_0011f025;
                                    pcVar11 = 
                                    "av1c: Could not read bits for order_hint_bits_minus_1, value=%d result=%d.\n"
                                    ;
                                  }
                                }
                                else {
LAB_0011f44e:
                                  uVar3 = aom_rb_read_bit(&local_a8);
                                  if (result == -1) {
                                    pcVar11 = 
                                    "av1c: Error reading bit for seq_choose_integer_mv, value=%d result=%d.\n"
                                    ;
                                  }
                                  else {
                                    if ((uVar3 != 0) ||
                                       (uVar3 = aom_rb_read_bit(&local_a8), result != -1))
                                    goto LAB_0011f47c;
                                    pcVar11 = 
                                    "av1c: Error reading bit for seq_force_integer_mv, value=%d result=%d.\n"
                                    ;
                                  }
                                }
                              }
                              else {
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (result == -1) {
                                  pcVar11 = 
                                  "av1c: Error reading bit for enable_dist_wtd_comp, value=%d result=%d.\n"
                                  ;
                                }
                                else {
                                  uVar3 = aom_rb_read_bit(&local_a8);
                                  if (result != -1) goto LAB_0011f41c;
                                  pcVar11 = 
                                  "av1c: Error reading bit for enable_ref_frame_mvs, value=%d result=%d.\n"
                                  ;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
LAB_0011f025:
                      uVar3 = aom_rb_read_bit(&local_a8);
                      if (result == -1) {
                        pcVar11 = 
                        "av1c: Error reading bit for enable_superres, value=%d result=%d.\n";
                      }
                      else {
                        uVar3 = aom_rb_read_bit(&local_a8);
                        if (result == -1) {
                          pcVar11 = "av1c: Error reading bit for enable_cdef, value=%d result=%d.\n"
                          ;
                        }
                        else {
                          uVar3 = aom_rb_read_bit(&local_a8);
                          pvVar1 = local_a8.error_handler_data;
                          if (result != -1) {
                            local_a8.error_handler_data = &local_ac;
                            local_ac = 0;
                            uVar3 = aom_rb_read_bit(&local_a8);
                            if (local_ac == -1) {
                              pcVar11 = 
                              "av1c: Error reading bit for high_bitdepth, value=%d result=%d.\n";
LAB_0011fa82:
                              uVar10 = (ulong)uVar3;
                            }
                            else {
                              config->high_bitdepth = (uint8_t)uVar3;
                              uVar8 = config->seq_profile;
                              if ((uint8_t)uVar3 == '\0' || uVar8 != '\x02') {
                                bVar13 = false;
                              }
                              else {
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (local_ac == -1) {
                                  pcVar11 = 
                                  "av1c: Error reading bit for twelve_bit, value=%d result=%d.\n";
                                  goto LAB_0011fa82;
                                }
                                config->twelve_bit = (uint8_t)uVar3;
                                bVar13 = (uint8_t)uVar3 != '\0';
                                uVar8 = config->seq_profile;
                              }
                              if (uVar8 != '\x01') {
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (local_ac == -1) {
                                  pcVar11 = 
                                  "av1c: Error reading bit for mono_chrome, value=%d result=%d.\n";
                                  goto LAB_0011fa82;
                                }
                                config->monochrome = (uint8_t)uVar3;
                              }
                              uVar3 = aom_rb_read_bit(&local_a8);
                              if (local_ac == -1) {
                                pcVar11 = 
                                "av1c: Error reading bit for color_description_present_flag, value=%d result=%d.\n"
                                ;
                                goto LAB_0011fa82;
                              }
                              if (uVar3 == 0) {
                                uVar7 = 2;
                                uVar6 = uVar7;
                                uVar3 = uVar7;
LAB_0011f575:
                                if (config->monochrome == '\0') {
                                  if ((uVar7 == 0xd && uVar6 == 1) && uVar3 == 0) {
LAB_0011f5d8:
                                    config->chroma_subsampling_x = '\0';
                                    goto LAB_0011f5dc;
                                  }
                                  uVar3 = aom_rb_read_bit(&local_a8);
                                  if (local_ac == -1) goto LAB_0011f8a8;
                                  if (config->seq_profile == '\0') {
                                    config->chroma_subsampling_x = '\x01';
                                    config->chroma_subsampling_y = '\x01';
LAB_0011f7ce:
                                    uVar3 = aom_rb_read_literal(&local_a8,2);
                                    if (local_ac != -1) {
                                      lStack_c0 = 10;
                                      goto LAB_0011f59a;
                                    }
                                    pcVar11 = 
                                    "av1c: Could not read bits for chroma_sample_position, value=%d result=%d.\n"
                                    ;
                                    goto LAB_0011fa82;
                                  }
                                  if (config->seq_profile == '\x01') goto LAB_0011f5d8;
                                  if (!bVar13) {
                                    config->chroma_subsampling_x = '\x01';
LAB_0011f5dc:
                                    lStack_c0 = 9;
                                    uVar8 = '\0';
                                    goto LAB_0011f5e1;
                                  }
                                  uVar3 = aom_rb_read_bit(&local_a8);
                                  if (local_ac == -1) {
                                    pcVar11 = 
                                    "av1c: Error reading bit for subsampling_x, value=%d result=%d.\n"
                                    ;
                                    goto LAB_0011fa82;
                                  }
                                  config->chroma_subsampling_x = (uint8_t)uVar3;
                                  if (uVar3 == 0) goto LAB_0011f5dc;
                                  uVar3 = aom_rb_read_bit(&local_a8);
                                  if (local_ac == -1) {
                                    pcVar11 = 
                                    "av1c: Error reading bit for subsampling_y, value=%d result=%d.\n"
                                    ;
                                    goto LAB_0011fa82;
                                  }
                                  config->chroma_subsampling_y = (uint8_t)uVar3;
                                  if (config->chroma_subsampling_x != '\0' && (uint8_t)uVar3 != '\0'
                                     ) goto LAB_0011f7ce;
                                }
                                else {
                                  uVar3 = aom_rb_read_bit(&local_a8);
                                  if (local_ac == -1) {
LAB_0011f8a8:
                                    pcVar11 = 
                                    "av1c: Error reading bit for color_range, value=%d result=%d.\n"
                                    ;
                                    goto LAB_0011fa82;
                                  }
                                  config->chroma_subsampling_x = '\x01';
                                  uVar3 = 1;
                                  lStack_c0 = 9;
LAB_0011f59a:
                                  uVar8 = (uint8_t)uVar3;
LAB_0011f5e1:
                                  (&config->marker)[lStack_c0] = uVar8;
                                }
                                if ((config->monochrome != '\0') ||
                                   (uVar3 = aom_rb_read_bit(&local_a8), local_ac != -1)) {
                                  local_a8.error_handler_data = pvVar1;
                                  if (local_ac != 0) goto LAB_0011fa8e;
                                  uVar3 = aom_rb_read_bit(&local_a8);
                                  if (result != -1) {
                                    return 0;
                                  }
                                  pcVar11 = 
                                  "av1c: Error reading bit for film_grain_params_present, value=%d result=%d.\n"
                                  ;
                                  goto LAB_0011fc18;
                                }
                                pcVar11 = 
                                "av1c: Error reading bit for separate_uv_delta_q, value=%d result=%d.\n"
                                ;
                                goto LAB_0011fa82;
                              }
                              uVar6 = aom_rb_read_literal(&local_a8,8);
                              uVar10 = (ulong)uVar6;
                              if (local_ac == -1) {
                                pcVar11 = 
                                "av1c: Could not read bits for color_primaries_val, value=%d result=%d.\n"
                                ;
                              }
                              else {
                                uVar7 = aom_rb_read_literal(&local_a8,8);
                                if (local_ac != -1) {
                                  uVar3 = aom_rb_read_literal(&local_a8,8);
                                  if (local_ac == -1) {
                                    pcVar11 = 
                                    "av1c: Could not read bits for matrix_coefficients_val, value=%d result=%d.\n"
                                    ;
                                    goto LAB_0011fa82;
                                  }
                                  goto LAB_0011f575;
                                }
                                pcVar11 = 
                                "av1c: Could not read bits for transfer_characteristics_val, value=%d result=%d.\n"
                                ;
                                uVar10 = (ulong)uVar7;
                              }
                            }
                            fprintf(_stderr,pcVar11,uVar10,0xffffffffffffffff);
LAB_0011fa8e:
                            fwrite("av1c: color_config() parse failed.\n",0x23,1,_stderr);
                            return -1;
                          }
                          pcVar11 = 
                          "av1c: Error reading bit for enable_restoration, value=%d result=%d.\n";
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_0011fc18;
          }
          pcVar11 = "av1c: Could not read bits for frame_height_bits_minus_1, value=%d result=%d.\n"
          ;
LAB_0011f6af:
          uVar10 = (ulong)uVar4;
        }
      }
    }
  }
  uVar9 = 0xffffffff;
LAB_0011fc1f:
  fprintf(_stderr,pcVar11,uVar10,uVar9);
  return -1;
}

Assistant:

int get_av1config_from_obu(const uint8_t *buffer, size_t length, int is_annexb,
                           Av1Config *config) {
  if (!buffer || length == 0 || !config) {
    return -1;
  }

  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));

  size_t sequence_header_length = 0;
  size_t obu_header_length = 0;
  if (aom_read_obu_header_and_size(buffer, length, is_annexb, &obu_header,
                                   &sequence_header_length,
                                   &obu_header_length) != AOM_CODEC_OK ||
      obu_header.type != OBU_SEQUENCE_HEADER ||
      sequence_header_length + obu_header_length > length) {
    return -1;
  }

  memset(config, 0, sizeof(*config));
  config->marker = 1;
  config->version = 1;
  return parse_sequence_header(buffer + obu_header_length,
                               sequence_header_length, config);
}